

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::
elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
::format(elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
         *this,log_msg *msg,tm *param_2,memory_buf_t *dest)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  scoped_padder p;
  scoped_padder local_40;
  
  lVar1 = (msg->time).__d.__r;
  uVar3 = lVar1 - (this->last_message_time_).__d.__r;
  if ((long)uVar3 < 1) {
    uVar3 = 0;
  }
  (this->last_message_time_).__d.__r = lVar1;
  uVar2 = ::fmt::v8::detail::do_count_digits(uVar3 / 1000000000);
  scoped_padder::scoped_padder(&local_40,(ulong)uVar2,&(this->super_flag_formatter).padinfo_,dest);
  fmt_helper::append_int<unsigned_long>(uVar3 / 1000000000,dest);
  scoped_padder::~scoped_padder(&local_40);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto delta = (std::max)(msg.time - last_message_time_, log_clock::duration::zero());
        auto delta_units = std::chrono::duration_cast<DurationUnits>(delta);
        last_message_time_ = msg.time;
        auto delta_count = static_cast<size_t>(delta_units.count());
        auto n_digits = static_cast<size_t>(ScopedPadder::count_digits(delta_count));
        ScopedPadder p(n_digits, padinfo_, dest);
        fmt_helper::append_int(delta_count, dest);
    }